

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O2

void Wlc_NtkCollectBoxes(Wlc_Ntk_t *p,Vec_Int_t *vBoxIds)

{
  int *p_00;
  int iVar1;
  Vec_Int_t *p_01;
  int i;
  
  p_01 = Vec_IntAlloc(vBoxIds->nSize + 1);
  Vec_IntPush(p_01,vBoxIds->nSize);
  for (i = 0; i < vBoxIds->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vBoxIds,i);
    iVar1 = Vec_IntEntry(&p->vNameIds,iVar1);
    Vec_IntPush(p_01,iVar1);
  }
  p_00 = p_01->pArray;
  p_01->nCap = 0;
  p_01->nSize = 0;
  p_01->pArray = (int *)0x0;
  Abc_FrameSetBoxes(p_00);
  Vec_IntFree(p_01);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collect adds and mults.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkCollectBoxes( Wlc_Ntk_t * p, Vec_Int_t * vBoxIds )
{
    int i, iObj;
    Vec_Int_t * vBoxes = Vec_IntAlloc( Vec_IntSize(vBoxIds) + 1 );
    Vec_IntPush( vBoxes, Vec_IntSize(vBoxIds) );
    Vec_IntForEachEntry( vBoxIds, iObj, i )
        Vec_IntPush( vBoxes, Wlc_ObjNameId(p, iObj) );
    Abc_FrameSetBoxes( Vec_IntReleaseArray(vBoxes) );
    Vec_IntFree( vBoxes );
}